

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

string_view __thiscall libtorrent::torrent_info::ssl_cert(torrent_info *this)

{
  bool bVar1;
  type_t tVar2;
  char *start;
  char *pcVar3;
  string_view local_58;
  string_view local_48;
  undefined1 local_38 [8];
  error_code ec;
  torrent_info *this_local;
  
  ec.cat_._6_1_ = (this->m_flags).m_val;
  ec.cat_._5_1_ = '\b';
  ec.cat_._7_1_ =
       libtorrent::flags::operator&
                 (ec.cat_._6_1_,
                  (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)'\b');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                    ((bitfield_flag *)((long)&ec.cat_ + 7));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = bdecode_node::operator_cast_to_bool(&this->m_info_dict);
    if (!bVar1) {
      boost::system::error_code::error_code((error_code *)local_38);
      start = boost::shared_array<char>::get(&this->m_info_section);
      pcVar3 = boost::shared_array<char>::get(&this->m_info_section);
      bdecode(start,pcVar3 + this->m_info_section_size,&this->m_info_dict,(error_code *)local_38,
              (int *)0x0,100,2000000);
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_38);
      if (bVar1) {
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"");
        return _this_local;
      }
    }
    tVar2 = bdecode_node::type(&this->m_info_dict);
    if (tVar2 == dict_t) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,"ssl-cert");
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58);
      _this_local = bdecode_node::dict_find_string_value(&this->m_info_dict,local_48,local_58);
    }
    else {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"");
    }
  }
  else {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"");
  }
  return _this_local;
}

Assistant:

string_view torrent_info::ssl_cert() const
	{
		if (!(m_flags & ssl_torrent)) return "";

		// this is parsed lazily
		if (!m_info_dict)
		{
			error_code ec;
			bdecode(m_info_section.get(), m_info_section.get()
				+ m_info_section_size, m_info_dict, ec);
			TORRENT_ASSERT(!ec);
			if (ec) return "";
		}
		TORRENT_ASSERT(m_info_dict.type() == bdecode_node::dict_t);
		if (m_info_dict.type() != bdecode_node::dict_t) return "";
		return m_info_dict.dict_find_string_value("ssl-cert");
	}